

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest20_21::FunctionalTest20_21
          (FunctionalTest20_21 *this,Context *context)

{
  GLuint i;
  long lVar1;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"multiple_contexts",
             "Verifies that shader uniforms are preserved when rendering context is switched.");
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01dd2750;
  for (lVar1 = 0; lVar1 != 5; lVar1 = lVar1 + 1) {
    this->m_program_pipelines[lVar1] = 0;
  }
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    this->m_shared_contexts[lVar1] = (RenderContext *)0x0;
  }
  return;
}

Assistant:

FunctionalTest20_21::FunctionalTest20_21(deqp::Context& context)
	: TestCase(context, "multiple_contexts",
			   "Verifies that shader uniforms are preserved when rendering context is switched.")
{
	for (GLuint i = 0; i < m_n_shared_contexts + 1; ++i)
	{
		m_program_pipelines[i] = 0;
	}

	for (GLuint i = 0; i < m_n_shared_contexts; ++i)
	{
		m_shared_contexts[i] = 0;
	}
}